

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::PropertyRecord_const*>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key)

{
  hash_t hashCode;
  int iVar1;
  long lVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  hash_t hVar7;
  undefined4 *puVar8;
  long lVar9;
  int *piVar10;
  
  lVar2 = *(long *)this;
  if (lVar2 == 0) {
    uVar6 = 0;
  }
  else {
    hashCode = (*key)->hash * 2 + 1;
    uVar6 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                         *)this,hashCode);
    lVar3 = *(long *)(this + 8);
    piVar10 = (int *)(lVar2 + (ulong)uVar6 * 4);
    uVar6 = 0;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      iVar1 = *piVar10;
      if ((long)iVar1 < 0) break;
      lVar9 = (long)iVar1 * 0x18;
      lVar2 = lVar9 + lVar3;
      hVar7 = Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::GetHashCode
                        (*(JavascriptString **)(lVar3 + 8 + lVar9));
      hVar7 = hVar7 * 2 + 1;
      if (hVar7 != *(hash_t *)(lVar3 + 0x10 + lVar9)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
        hVar7 = *(hash_t *)(lVar2 + 0x10);
      }
      if ((hVar7 == hashCode) &&
         (bVar5 = Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals
                            (*(JavascriptString **)(lVar2 + 8),*key), bVar5)) {
        if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
          return iVar1;
        }
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar6);
        return iVar1;
      }
      uVar6 = uVar6 + 1;
      piVar10 = (int *)(lVar2 + 4);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar6);
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }